

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjDecompress(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width,
                int pitch,int height,int pixelSize,int flags)

{
  int iVar1;
  
  if (((uint)flags >> 9 & 1) == 0) {
    iVar1 = getPixelFormat(pixelSize,flags);
    iVar1 = tjDecompress2(handle,jpegBuf,jpegSize,dstBuf,width,pitch,height,iVar1,flags);
    return iVar1;
  }
  iVar1 = tjDecompressToYUV(handle,jpegBuf,jpegSize,dstBuf,flags);
  return iVar1;
}

Assistant:

DLLEXPORT int tjDecompress(tjhandle handle, unsigned char *jpegBuf,
                           unsigned long jpegSize, unsigned char *dstBuf,
                           int width, int pitch, int height, int pixelSize,
                           int flags)
{
  if (flags & TJ_YUV)
    return tjDecompressToYUV(handle, jpegBuf, jpegSize, dstBuf, flags);
  else
    return tjDecompress2(handle, jpegBuf, jpegSize, dstBuf, width, pitch,
                         height, getPixelFormat(pixelSize, flags), flags);
}